

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void __thiscall hwnet::ThreadPool::TaskQueue::Close(TaskQueue *this)

{
  std::mutex::lock(&this->mtx);
  if (this->closed == false) {
    this->closed = true;
    std::_V2::condition_variable_any::notify_all(&this->cv);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ThreadPool::TaskQueue::Close() {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(!this->closed) {
		this->closed = true;
		this->cv.notify_all();
	}
}